

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O3

void av1_setup_src_planes
               (MACROBLOCK *x,YV12_BUFFER_CONFIG *src,int mi_row,int mi_col,int num_planes,
               BLOCK_SIZE bsize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  int *piVar5;
  int y;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  int x_1;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  (x->e_mbd).cur_buf = src;
  if (0 < num_planes) {
    uVar8 = 3;
    if ((uint)num_planes < 3) {
      uVar8 = (ulong)(uint)num_planes;
    }
    piVar5 = &(x->e_mbd).plane[0].subsampling_y;
    piVar7 = &x->plane[0].src.stride;
    uVar10 = 0;
    do {
      uVar11 = (ulong)(uVar10 != 0);
      puVar4 = src->store_buf_adr[uVar10 - 4];
      iVar1 = *(int *)((long)src->store_buf_adr + uVar11 * 4 + -0x28);
      uVar6 = (uint)((0x20005UL >> ((ulong)bsize & 0x3f) & 1) != 0);
      if (*piVar5 == 0) {
        uVar6 = 0;
      }
      uVar9 = (uint)((0x10003UL >> ((ulong)bsize & 0x3f) & 1) != 0);
      if (piVar5[-1] == 0) {
        uVar9 = 0;
      }
      iVar2 = *(int *)((long)src->store_buf_adr + uVar11 * 4 + -0x38);
      iVar3 = *(int *)((long)src->store_buf_adr + uVar11 * 4 + -0x30);
      ((buf_2d *)(piVar7 + -6))->buf =
           puVar4 + (long)((int)((~uVar6 & mi_row) << 2) >> ((byte)*piVar5 & 0x1f)) * (long)iVar1 +
                    (long)((int)((~uVar9 & mi_col) << 2) >> ((byte)piVar5[-1] & 0x1f));
      *(uint8_t **)(piVar7 + -4) = puVar4;
      piVar7[-2] = iVar2;
      piVar7[-1] = iVar3;
      *piVar7 = iVar1;
      uVar10 = uVar10 + 1;
      piVar5 = piVar5 + 0x28c;
      piVar7 = piVar7 + 0x22;
    } while (uVar8 != uVar10);
  }
  return;
}

Assistant:

void av1_setup_src_planes(MACROBLOCK *x, const YV12_BUFFER_CONFIG *src,
                          int mi_row, int mi_col, const int num_planes,
                          BLOCK_SIZE bsize) {
  // Set current frame pointer.
  x->e_mbd.cur_buf = src;

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); i++) {
    const int is_uv = i > 0;
    setup_pred_plane(
        &x->plane[i].src, bsize, src->buffers[i], src->crop_widths[is_uv],
        src->crop_heights[is_uv], src->strides[is_uv], mi_row, mi_col, NULL,
        x->e_mbd.plane[i].subsampling_x, x->e_mbd.plane[i].subsampling_y);
  }
}